

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  char *pcVar1;
  String local_20;
  
  switch(c) {
  case L'\0':
    pcVar1 = "\\0";
    break;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_0012f069_caseD_1:
    if (0x5e < (uint)(c + L'\xffffffe0')) {
      String::Format((char *)&local_20,"\\x%X");
      operator<<(os,&local_20);
      String::~String(&local_20);
      return kHexEscape;
    }
    std::operator<<(os,(char)c);
    return kAsIs;
  case L'\a':
    pcVar1 = "\\a";
    break;
  case L'\b':
    pcVar1 = "\\b";
    break;
  case L'\t':
    pcVar1 = "\\t";
    break;
  case L'\n':
    pcVar1 = "\\n";
    break;
  case L'\v':
    pcVar1 = "\\v";
    break;
  case L'\f':
    pcVar1 = "\\f";
    break;
  case L'\r':
    pcVar1 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar1 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_0012f069_caseD_1;
      pcVar1 = "\\\\";
    }
  }
  std::operator<<(os,pcVar1);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << String::Format("\\x%X", static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}